

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O2

bool __thiscall csv::icu::StringDataSource::set(StringDataSource *this,string *text,char *codepage)

{
  bool bVar1;
  char *pcVar2;
  string cp;
  detected_language detected;
  char *local_80 [4];
  detected_language local_60;
  
  pcVar2 = "";
  if (codepage != (char *)0x0) {
    pcVar2 = codepage;
  }
  std::__cxx11::string::string((string *)local_80,pcVar2,(allocator *)&local_60);
  if (codepage == (char *)0x0) {
    encoding::TextEncodingForData(&local_60,(text->_M_dataplus)._M_p,text->_M_string_length);
    if (local_60.name._M_string_length == 0) {
      encoding::detected_language::~detected_language(&local_60);
      bVar1 = false;
      goto LAB_001156be;
    }
    std::__cxx11::string::_M_assign((string *)local_80);
    encoding::detected_language::~detected_language(&local_60);
  }
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)&local_60,(text->_M_dataplus)._M_p,(int)text->_M_string_length,
             local_80[0]);
  icu_70::UnicodeString::operator=(&this->_in,(UnicodeString *)&local_60);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_60);
  bVar1 = true;
LAB_001156be:
  std::__cxx11::string::~string((string *)local_80);
  return bVar1;
}

Assistant:

bool StringDataSource::set(const std::string& text, const char* codepage) {
		std::string cp = codepage ?: "";
		if (codepage == NULL) {
			const auto detected = encoding::TextEncodingForData(text.c_str(), text.length());
			if (detected.invalid()) {
				return false;
			}
			cp = detected.name;
		}

		_in = U_ICU_NAMESPACE::UnicodeString(text.c_str(), (int)(text.length()), cp.c_str());
		return true;
	}